

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O0

void drawGrid(float scale,int steps)

{
  float local_8c [2];
  vec3 up;
  vec3 center;
  vec3 eye;
  mat4x4 view;
  float y;
  float x;
  int i;
  int steps_local;
  float scale_local;
  
  glPushMatrix();
  glClearColor();
  glClear(0x4000);
  center[1] = 0.0;
  center[2] = 0.0;
  eye[0] = 1.0;
  memset(up + 1,0,0xc);
  local_8c[0] = 0.0;
  local_8c[1] = 1.0;
  up[0] = 0.0;
  mat4x4_look_at((vec4 *)(eye + 1),center + 1,up + 1,local_8c);
  glLoadMatrixf(eye + 1);
  glDepthMask(0);
  glColor3f();
  glBegin(1);
  for (y = 0.0; (int)y < steps; y = (float)((int)y + 1)) {
    glVertex3f(-(scale * 0.5 * (float)(steps + -1)));
    glVertex3f();
  }
  for (y = 0.0; (int)y < steps; y = (float)((int)y + 1)) {
    glVertex3f();
    glVertex3f();
  }
  glEnd();
  glDepthMask(1);
  glPopMatrix();
  return;
}

Assistant:

static void drawGrid(float scale, int steps)
{
    int i;
    float x, y;
    mat4x4 view;

    glPushMatrix();

    // Set background to some dark bluish grey
    glClearColor(0.05f, 0.05f, 0.2f, 0.0f);
    glClear(GL_COLOR_BUFFER_BIT);

    // Setup modelview matrix (flat XY view)
    {
        vec3 eye = { 0.f, 0.f, 1.f };
        vec3 center = { 0.f, 0.f, 0.f };
        vec3 up = { 0.f, 1.f, 0.f };
        mat4x4_look_at(view, eye, center, up);
    }
    glLoadMatrixf((const GLfloat*) view);

    // We don't want to update the Z-buffer
    glDepthMask(GL_FALSE);

    // Set grid color
    glColor3f(0.0f, 0.5f, 0.5f);

    glBegin(GL_LINES);

    // Horizontal lines
    x = scale * 0.5f * (float) (steps - 1);
    y = -scale * 0.5f * (float) (steps - 1);
    for (i = 0;  i < steps;  i++)
    {
        glVertex3f(-x, y, 0.0f);
        glVertex3f(x, y, 0.0f);
        y += scale;
    }

    // Vertical lines
    x = -scale * 0.5f * (float) (steps - 1);
    y = scale * 0.5f * (float) (steps - 1);
    for (i = 0;  i < steps;  i++)
    {
        glVertex3f(x, -y, 0.0f);
        glVertex3f(x, y, 0.0f);
        x += scale;
    }

    glEnd();

    // Enable Z-buffer writing again
    glDepthMask(GL_TRUE);

    glPopMatrix();
}